

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  value_type *ppcVar1;
  int iVar2;
  GLFWwindow *handle;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  EVP_PKEY_CTX *ctx;
  char **__x;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  size_t sStack_60;
  int local_48;
  
  iVar6 = 1;
  local_48 = 1;
  do {
    if (argc <= iVar6) {
      glfwInit();
      glfwWindowHint(0x22002,4);
      glfwWindowHint(0x22003,5);
      glfwWindowHint(0x22008,0x32001);
      glfwWindowHint(0x22007,1);
      glfwWindowHint(0x20004,local_48);
      fwrite("Loading {Window-Main}\n",0x16,1,_stdout);
      fflush(_stdout);
      handle = glfwCreateWindow(0x400,0x400,"Hello MERL",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle == (GLFWwindow *)0x0) {
        fwrite("=> Failure <=\n",0xe,1,_stdout);
        fflush(_stdout);
        glfwTerminate();
      }
      else {
        glfwMakeContextCurrent(handle);
        glfwSetKeyCallback(handle,keyboardCallback);
        glfwSetCursorPosCallback(handle,mouseMotionCallback);
        glfwSetMouseButtonCallback(handle,mouseButtonCallback);
        glfwSetScrollCallback(handle,mouseScrollCallback);
        fwrite("Loading {OpenGL}\n",0x11,1,_stdout);
        fflush(_stdout);
        iVar6 = gladLoadGLLoader(glfwGetProcAddress);
        if (iVar6 != 0) {
          log_debug_output();
          fwrite("-- Begin -- Demo\n",0x11,1,_stdout);
          fflush(_stdout);
          ImGui::CreateContext((ImFontAtlas *)0x0);
          ImGui_ImplGlfwGL3_Init(handle,false,(char *)0x0);
          ctx = (EVP_PKEY_CTX *)0x0;
          ImGui::StyleColorsDark((ImGuiStyle *)0x0);
          init(ctx);
          while ((iVar6 = glfwWindowShouldClose(handle), iVar6 == 0 &&
                 ((uint)g_app.frame < (uint)g_app.frameLimit))) {
            glfwPollEvents();
            render();
            g_app.frame = g_app.frame + 1;
            glfwSwapBuffers(handle);
          }
          release();
          ImGui_ImplGlfwGL3_Shutdown();
          ImGui::DestroyContext((ImGuiContext *)0x0);
          glfwTerminate();
          fwrite("-- End -- Demo\n",0xf,1,_stdout);
          fflush(_stdout);
          return 0;
        }
        fwrite("gladLoadGLLoader failed\n",0x18,1,_stdout);
        fflush(_stdout);
      }
      return -1;
    }
    lVar4 = (long)iVar6;
    pcVar5 = argv[lVar4];
    iVar2 = strcmp("--merl",pcVar5);
    if (iVar2 == 0) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&g_sphere.shading,0);
      __x = argv + lVar4 + 1;
      lVar4 = lVar4 + 2;
      do {
        iVar6 = iVar6 + 1;
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)&g_sphere.shading,__x);
        if (argc <= lVar4) break;
        ppcVar1 = __x + 1;
        __x = __x + 1;
        lVar4 = lVar4 + 1;
      } while (**ppcVar1 != '-');
      uVar3 = (ulong)((long)g_sphere.shading.merl.files.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)g_sphere.shading.merl.files.
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3;
      pcVar5 = "Note: number of MERL BRDFs set to %i\n";
LAB_0014d329:
      fprintf(_stdout,pcVar5,uVar3);
      goto LAB_0014d3c6;
    }
    iVar2 = strcmp("--output-dir",pcVar5);
    if (iVar2 == 0) {
      g_app.dir.output = argv[lVar4 + 1];
      pcVar5 = "Note: output directory set to %s\n";
LAB_0014d379:
      iVar6 = iVar6 + 1;
      fprintf(_stdout,pcVar5);
LAB_0014d3c6:
      fflush(_stdout);
    }
    else {
      iVar2 = strcmp("--shader-dir",pcVar5);
      if (iVar2 == 0) {
        g_app.dir.shader = argv[lVar4 + 1];
        pcVar5 = "Note: shader directory set to %s\n";
        goto LAB_0014d379;
      }
      iVar2 = strcmp("--record",pcVar5);
      if (iVar2 == 0) {
        g_app.recorder.on = 1;
        pcVar5 = "Note: recording enabled\n";
LAB_0014d39e:
        sStack_60 = 0x18;
LAB_0014d3bd:
        fwrite(pcVar5,sStack_60,1,_stdout);
        goto LAB_0014d3c6;
      }
      iVar2 = strcmp("--no-hud",pcVar5);
      if (iVar2 == 0) {
        g_app.viewer.hud = false;
        pcVar5 = "Note: HUD rendering disabled\n";
        sStack_60 = 0x1d;
        goto LAB_0014d3bd;
      }
      iVar2 = strcmp("--hidden",pcVar5);
      if (iVar2 == 0) {
        fwrite("Note: viewer will run hidden\n",0x1d,1,_stdout);
        local_48 = 0;
        goto LAB_0014d3c6;
      }
      iVar2 = strcmp("--frame-limit",pcVar5);
      if (iVar2 == 0) {
        iVar6 = iVar6 + 1;
        g_app.frameLimit = atoi(argv[lVar4 + 1]);
        pcVar5 = "Note: frame limit set to %i\n";
        uVar3 = (ulong)(uint)g_app.frameLimit;
        goto LAB_0014d329;
      }
      iVar2 = strcmp("--cmap",pcVar5);
      if (iVar2 == 0) {
        g_sphere.shading.pathToCmap = argv[lVar4 + 1];
        pcVar5 = "Note: cmap set to: %s\n";
        goto LAB_0014d379;
      }
      iVar2 = strcmp("--dir",pcVar5);
      if (iVar2 == 0) {
        dVar7 = atof(argv[lVar4 + 1]);
        iVar6 = iVar6 + 2;
        g_sphere.brdf.thetaI = (float)dVar7;
        dVar8 = atof(argv[lVar4 + 2]);
        g_sphere.brdf.phiI = (float)dVar8;
        fprintf(_stdout,"Note: wi set to: (%f %f)\n",(double)(float)dVar7,(double)g_sphere.brdf.phiI
               );
        goto LAB_0014d3c6;
      }
      iVar2 = strcmp("--alpha",pcVar5);
      if ((iVar2 == 0) || (iVar2 = strcmp("--sc",pcVar5), iVar2 == 0)) {
        iVar6 = iVar6 + 1;
        dVar7 = atof(argv[lVar4 + 1]);
        g_sphere.brdf.ggxAlpha = (float)dVar7;
        fprintf(_stdout,"Note: GGX alpha set to: %f\n",(double)g_sphere.brdf.ggxAlpha);
        goto LAB_0014d3c6;
      }
      iVar2 = strcmp("--color",pcVar5);
      if (iVar2 == 0) {
        dVar7 = atof(argv[lVar4 + 1]);
        g_sphere.sphere.color.r = (float)dVar7;
        dVar8 = atof(argv[lVar4 + 2]);
        g_sphere.sphere.color.g = (float)dVar8;
        dVar9 = atof(argv[lVar4 + 3]);
        iVar6 = iVar6 + 4;
        g_sphere.sphere.color.b = (float)dVar9;
        dVar10 = atof(argv[lVar4 + 4]);
        g_sphere.sphere.color.a = (float)dVar10;
        fprintf(_stdout,"Note: surface color set to: (%f %f %f %f)\n",(double)(float)dVar7,
                (double)(float)dVar8,(double)(float)dVar9,(double)g_sphere.sphere.color.a);
        goto LAB_0014d3c6;
      }
      iVar2 = strcmp("--enable-sphere-lines",pcVar5);
      if (iVar2 == 0) {
        g_sphere.flags.showLines = true;
        pcVar5 = "Note: rendering flag sphere-lines set to true\n";
        sStack_60 = 0x2e;
        goto LAB_0014d3bd;
      }
      iVar2 = strcmp("--disable-sphere-lines",pcVar5);
      if (iVar2 == 0) {
        g_sphere.flags.showLines = false;
        pcVar5 = "Note: rendering flag sphere-lines set to false\n";
        sStack_60 = 0x2f;
        goto LAB_0014d3bd;
      }
      iVar2 = strcmp("--enable-sphere-surface",pcVar5);
      if (iVar2 == 0) {
        g_sphere.flags.showSurface = true;
        pcVar5 = "Note: rendering flag sphere-surface set to true\n";
LAB_0014d61a:
        sStack_60 = 0x30;
        goto LAB_0014d3bd;
      }
      iVar2 = strcmp("--disable-sphere-surface",pcVar5);
      if (iVar2 == 0) {
        g_sphere.flags.showSurface = false;
        pcVar5 = "Note: rendering flag sphere-surface set to false\n";
LAB_0014d63a:
        sStack_60 = 0x31;
        goto LAB_0014d3bd;
      }
      iVar2 = strcmp("--enable-sphere-samples",pcVar5);
      if (iVar2 == 0) {
        g_sphere.flags.showSamples = true;
        pcVar5 = "Note: rendering flag sphere-samples set to true\n";
        goto LAB_0014d61a;
      }
      iVar2 = strcmp("--disable-sphere-samples",pcVar5);
      if (iVar2 == 0) {
        g_sphere.flags.showSamples = false;
        pcVar5 = "Note: rendering flag sphere-samples set to false\n";
        goto LAB_0014d63a;
      }
      iVar2 = strcmp("--enable-sphere-wi-helper",pcVar5);
      if (iVar2 == 0) {
        g_sphere.flags.showWiHelper = true;
        pcVar5 = "Note: rendering flag sphere-wi-helper set to true\n";
        sStack_60 = 0x32;
        goto LAB_0014d3bd;
      }
      iVar2 = strcmp("--disable-sphere-wi-helper",pcVar5);
      if (iVar2 == 0) {
        g_sphere.flags.showWiHelper = false;
        pcVar5 = "Note: rendering flag sphere-wi-helper set to false\n";
        sStack_60 = 0x33;
        goto LAB_0014d3bd;
      }
      iVar2 = strcmp("--enable-parametric",pcVar5);
      if (iVar2 == 0) {
        g_sphere.flags.showParametric = true;
        pcVar5 = "Note: rendering flag parametric set to true\n";
        sStack_60 = 0x2c;
        goto LAB_0014d3bd;
      }
      iVar2 = strcmp("--disable-parametric",pcVar5);
      if (iVar2 == 0) {
        g_sphere.flags.showParametric = false;
        pcVar5 = "Note: rendering flag parametric set to false\n";
        sStack_60 = 0x2d;
        goto LAB_0014d3bd;
      }
      iVar2 = strcmp("--shading-color",pcVar5);
      if (iVar2 == 0) {
        g_sphere.shading.mode = 0;
        pcVar5 = "Note: shading mode set to color\n";
        sStack_60 = 0x20;
        goto LAB_0014d3bd;
      }
      iVar2 = strcmp("--shading-cmap",pcVar5);
      if (iVar2 == 0) {
        g_sphere.shading.mode = 1;
        pcVar5 = "Note: shading mode set to cmap\n";
LAB_0014d71b:
        sStack_60 = 0x1f;
        goto LAB_0014d3bd;
      }
      iVar2 = strcmp("--shading-brdf",pcVar5);
      if (iVar2 == 0) {
        g_sphere.shading.mode = 2;
        pcVar5 = "Note: shading mode set to brdf\n";
        goto LAB_0014d71b;
      }
      iVar2 = strcmp("--scheme-ggx",pcVar5);
      if (iVar2 == 0) {
        g_sphere.samples.scheme = 1;
        pcVar5 = "Note: scheme set to ggx\n";
        goto LAB_0014d39e;
      }
      iVar2 = strcmp("--scheme-merl",pcVar5);
      if (iVar2 == 0) {
        g_sphere.samples.scheme = 0;
        pcVar5 = "Note: scheme set to merl\n";
        sStack_60 = 0x19;
        goto LAB_0014d3bd;
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

int main(int argc, const char **argv)
{
    GLenum startVisible = GL_TRUE;

    #define PARSE_SHADING_MODE(str, enumval)               \
    else if (!strcmp("--shading-" str, argv[i])) {      \
            g_sphere.shading.mode = enumval;              \
            LOG("Note: shading mode set to " str "\n");  \
    }
    #define PARSE_SAMPLING_SCHEME(str, enumval)               \
    else if (!strcmp("--scheme-" str, argv[i])) {      \
            g_sphere.samples.scheme = enumval;              \
            LOG("Note: scheme set to " str "\n");  \
    }
    #define PARSE_SPHERE_FLAG(str, flag)                    \
    else if (!strcmp("--enable-" str, argv[i])) {           \
        flag = true;                                        \
        LOG("Note: rendering flag " str " set to true\n");   \
    } else if  (!strcmp("--disable-" str, argv[i])) {       \
        flag = false;                                       \
        LOG("Note: rendering flag " str " set to false\n");  \
    }

    for (int i = 1; i < argc; ++i) {
        if (!strcmp("--merl", argv[i])) {
            g_sphere.shading.merl.files.resize(0);
            do {
                g_sphere.shading.merl.files.push_back(argv[++i]);
            } while ((i+1 < argc) && strncmp("-", argv[i+1], 1));
            LOG("Note: number of MERL BRDFs set to %i\n", (int)g_sphere.shading.merl.files.size());
        } else if (!strcmp("--output-dir", argv[i])) {
            g_app.dir.output = (const char *)argv[++i];
            LOG("Note: output directory set to %s\n", g_app.dir.output);
        } else if (!strcmp("--shader-dir", argv[i])) {
            g_app.dir.shader = (const char *)argv[++i];
            LOG("Note: shader directory set to %s\n", g_app.dir.shader);
        } else if (!strcmp("--record", argv[i])) {
            g_app.recorder.on = true;
            LOG("Note: recording enabled\n");
        } else if (!strcmp("--no-hud", argv[i])) {
            g_app.viewer.hud = false;
            LOG("Note: HUD rendering disabled\n");
        } else if (!strcmp("--hidden", argv[i])) {
            startVisible = GL_FALSE;
            LOG("Note: viewer will run hidden\n");
        } else if (!strcmp("--frame-limit", argv[i])) {
            g_app.frameLimit = atoi(argv[++i]);
            LOG("Note: frame limit set to %i\n", g_app.frameLimit);
        } else if (!strcmp("--cmap", argv[i])) {
            g_sphere.shading.pathToCmap = argv[++i];
            LOG("Note: cmap set to: %s\n", g_sphere.shading.pathToCmap);
        } else if (!strcmp("--dir", argv[i])) {
            g_sphere.brdf.thetaI = atof(argv[++i]);
            g_sphere.brdf.phiI = atof(argv[++i]);
            LOG("Note: wi set to: (%f %f)\n", g_sphere.brdf.thetaI, g_sphere.brdf.phiI);
        } else if (!strcmp("--alpha", argv[i])) {
            g_sphere.brdf.ggxAlpha = atof(argv[++i]);
            LOG("Note: GGX alpha set to: %f\n", g_sphere.brdf.ggxAlpha);
        }  else if (!strcmp("--sc", argv[i])) {
            g_sphere.brdf.ggxAlpha = atof(argv[++i]);
            LOG("Note: GGX alpha set to: %f\n", g_sphere.brdf.ggxAlpha);
        } else if (!strcmp("--color", argv[i])) {
            g_sphere.sphere.color.r = atof(argv[++i]);
            g_sphere.sphere.color.g = atof(argv[++i]);
            g_sphere.sphere.color.b = atof(argv[++i]);
            g_sphere.sphere.color.a = atof(argv[++i]);
            LOG("Note: surface color set to: (%f %f %f %f)\n",
                g_sphere.sphere.color.r,
                g_sphere.sphere.color.g,
                g_sphere.sphere.color.b,
                g_sphere.sphere.color.a);
        }
        PARSE_SPHERE_FLAG("sphere-lines", g_sphere.flags.showLines)
        PARSE_SPHERE_FLAG("sphere-surface", g_sphere.flags.showSurface)
        PARSE_SPHERE_FLAG("sphere-samples", g_sphere.flags.showSamples)
        PARSE_SPHERE_FLAG("sphere-wi-helper", g_sphere.flags.showWiHelper)
        PARSE_SPHERE_FLAG("parametric", g_sphere.flags.showParametric)
        PARSE_SHADING_MODE("color", SHADING_COLOR)
        PARSE_SHADING_MODE("cmap" , SHADING_COLORMAP)
        PARSE_SHADING_MODE("brdf" , SHADING_BRDF)
        PARSE_SAMPLING_SCHEME("ggx", SCHEME_GGX)
        PARSE_SAMPLING_SCHEME("merl", SCHEME_MERL)
    }

    glfwInit();
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);
    glfwWindowHint(GLFW_VISIBLE, startVisible);

    // Create the Window
    LOG("Loading {Window-Main}\n");
    GLFWwindow* window = glfwCreateWindow(
                             VIEWER_DEFAULT_WIDTH,
                             VIEWER_DEFAULT_HEIGHT,
                             "Hello MERL", NULL, NULL
                             );
    if (window == NULL) {
        LOG("=> Failure <=\n");
        glfwTerminate();
        return -1;
    }
    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, &keyboardCallback);
    glfwSetCursorPosCallback(window, &mouseMotionCallback);
    glfwSetMouseButtonCallback(window, &mouseButtonCallback);
    glfwSetScrollCallback(window, &mouseScrollCallback);

    // Load OpenGL functions
    LOG("Loading {OpenGL}\n");
    if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
        LOG("gladLoadGLLoader failed\n");
        return -1;
    }
    log_debug_output();

    LOG("-- Begin -- Demo\n");
    try {
        //log_debug_output();
        ImGui::CreateContext();
        ImGui_ImplGlfwGL3_Init(window, false);
        ImGui::StyleColorsDark();
        init();

        while (!glfwWindowShouldClose(window) && (uint32_t)g_app.frame < (uint32_t)g_app.frameLimit) {
            glfwPollEvents();

            render();
            ++g_app.frame;

            glfwSwapBuffers(window);
        }

        release();
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
    } catch (std::exception& e) {
        LOG("%s", e.what());
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    } catch (...) {
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    }
    LOG("-- End -- Demo\n");


    return 0;
}